

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O0

Value<google::protobuf::internal::GenericTypeHandler<std::string>_> * __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
UnsafeArenaReleaseLast<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
          (RepeatedPtrFieldBase *this)

{
  void *pvVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  char *failure_msg;
  LogMessage *pLVar5;
  void **ppvVar6;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar7;
  Rep *pRVar8;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *result;
  Voidify local_19;
  Nullable<const_char_*> local_18;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  RepeatedPtrFieldBase *this_local;
  
  absl_log_internal_check_op_result = (Nullable<const_char_*>)this;
  iVar3 = absl::lts_20250127::log_internal::GetReferenceableValue(this->current_size_);
  iVar4 = absl::lts_20250127::log_internal::GetReferenceableValue(0);
  local_18 = absl::lts_20250127::log_internal::Check_GTImpl(iVar3,iVar4,"current_size_ > 0");
  if (local_18 == (Nullable<const_char_*>)0x0) {
    ExchangeCurrentSize(this,this->current_size_ + -1);
    ppvVar6 = element_at(this,this->current_size_);
    pVVar7 = cast<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>(*ppvVar6);
    bVar2 = using_sso(this);
    if (bVar2) {
      this->tagged_rep_or_elem_ = (void *)0x0;
    }
    else {
      pRVar8 = rep(this);
      pRVar8->allocated_size = pRVar8->allocated_size + -1;
      iVar3 = this->current_size_;
      iVar4 = allocated_size(this);
      if (iVar3 < iVar4) {
        iVar3 = allocated_size(this);
        ppvVar6 = element_at(this,iVar3);
        pvVar1 = *ppvVar6;
        ppvVar6 = element_at(this,this->current_size_);
        *ppvVar6 = pvVar1;
      }
    }
    return pVVar7;
  }
  failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_18);
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&result,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field.h"
             ,0x1fe,failure_msg);
  pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream((LogMessage *)&result);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_19,pLVar5);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&result);
}

Assistant:

Value<TypeHandler>* UnsafeArenaReleaseLast() {
    ABSL_DCHECK_GT(current_size_, 0);
    ExchangeCurrentSize(current_size_ - 1);
    auto* result = cast<TypeHandler>(element_at(current_size_));
    if (using_sso()) {
      tagged_rep_or_elem_ = nullptr;
    } else {
      --rep()->allocated_size;
      if (current_size_ < allocated_size()) {
        // There are cleared elements on the end; replace the removed element
        // with the last allocated element.
        element_at(current_size_) = element_at(allocated_size());
      }
    }
    return result;
  }